

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O3

void __thiscall
burst::dynamic_tuple::push_back<(anonymous_namespace)::dummy>(dynamic_tuple *this,dummy *object)

{
  char *pcVar1;
  dummy *pdVar2;
  undefined1 extraout_DL;
  undefined7 in_register_00000011;
  undefined7 extraout_var;
  dummy *object_00;
  undefined1 uVar3;
  
  object_00 = (dummy *)this->m_capacity;
  pcVar1 = (this->m_data)._M_t.
           super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
           super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
           super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  pdVar2 = (dummy *)this->m_volume;
  uVar3 = object_00 == pdVar2;
  if (pcVar1 == (char *)0x0 || (bool)uVar3) {
    pdVar2 = pdVar2 + 2;
    if (object_00 < pdVar2) {
      object_00 = (dummy *)((long)object_00 * 2);
      if (object_00 <= pdVar2) {
        object_00 = pdVar2;
      }
      reallocate(this,(size_t)object_00);
    }
    pdVar2 = (dummy *)force_align<(anonymous_namespace)::dummy>(this,object_00);
    uVar3 = extraout_DL;
    in_register_00000011 = extraout_var;
  }
  else {
    pdVar2 = pdVar2 + (long)pcVar1;
  }
  accomodate<(anonymous_namespace)::dummy>
            (this,pdVar2,(int8_t *)CONCAT71(in_register_00000011,uVar3));
  return;
}

Assistant:

void push_back (T && object)
        {
            auto creation_place = set_up_creation_place(object);
            accomodate(std::forward<T>(object), creation_place);
        }